

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,optional<int> *value)

{
  bool bVar1;
  optional<int> local_30;
  int local_28 [2];
  int v;
  optional<int> *value_local;
  AsciiParser *this_local;
  
  _v = value;
  value_local = (optional<int> *)this;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<int>::operator=(_v);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ReadBasicType(this,local_28);
    if (bVar1) {
      nonstd::optional_lite::optional<int>::optional<int_&,_0>(&local_30,local_28);
      nonstd::optional_lite::optional<int>::operator=(_v,&local_30);
      nonstd::optional_lite::optional<int>::~optional(&local_30);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<int> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  int v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}